

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O1

IterateResult __thiscall deqp::gls::UniformBlockCase::iterate(UniformBlockCase *this)

{
  ShaderInterface *this_00;
  pointer *pppSVar1;
  _Alloc_hider __s;
  iterator __position;
  RenderContext *renderCtx;
  mapped_type pvVar2;
  code *pcVar3;
  void *pvVar4;
  pointer piVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  pointer puVar8;
  pointer pcVar9;
  int iVar10;
  DataType DVar11;
  deUint32 dVar12;
  deBool dVar13;
  deUint32 dVar14;
  DataType DVar15;
  undefined4 extraout_var;
  undefined8 *puVar16;
  pointer pUVar17;
  long *plVar18;
  mapped_type *ppvVar19;
  pointer pBVar20;
  pointer pBVar21;
  char *pcVar22;
  size_t sVar23;
  pointer ppUVar24;
  mapped_type_conflict *pmVar25;
  TestError *this_01;
  uint uVar26;
  int iVar27;
  _func_int **pp_Var28;
  long *plVar29;
  undefined8 *puVar30;
  deUint32 binding;
  UniformBlock *pUVar31;
  deUint32 binding_1;
  ulong uVar32;
  undefined1 isVertex;
  uint uVar33;
  ulong in_R9;
  long lVar34;
  undefined1 auVar35 [8];
  pointer pUVar36;
  pointer pBVar37;
  long lVar38;
  bool bVar39;
  bool bVar40;
  int numActiveUniforms;
  int curOffset;
  int numActiveBlocks;
  UniformLayout glLayout;
  UniformBufferManager bufferManager;
  int nameLen;
  deUint32 type;
  int size_1;
  GLsizei nameLen_1;
  UniformLayout refLayout;
  vector<int,_std::allocator<int>_> blockIndices;
  int numBlockUniforms;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<char,_std::allocator<char>_> nameBuf_1;
  Random rnd;
  vector<int,_std::allocator<int>_> rowMajorFlags;
  vector<int,_std::allocator<int>_> matrixStrides;
  vector<int,_std::allocator<int>_> arrayStrides;
  vector<int,_std::allocator<int>_> offsets;
  map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> blockPointers;
  ShaderProgram program;
  ostringstream vtxSrc;
  ostringstream fragSrc;
  char *local_7f8;
  int local_7ec;
  UniformBlockCase *local_7e8;
  long local_7e0;
  UniformBlock *local_7d8;
  undefined1 local_7d0 [32];
  _Base_ptr local_7b0;
  size_t local_7a8;
  int local_79c;
  undefined1 local_798 [24];
  vector<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
  vStack_780;
  TestLog *local_768;
  string local_760;
  int local_73c;
  int local_738;
  allocator<char> local_731;
  vector<int,_std::allocator<int>_> local_730;
  pointer local_718;
  pointer local_710;
  int local_704;
  int local_700;
  int local_6fc;
  UniformLayout local_6f8;
  vector<int,_std::allocator<int>_> local_6c0;
  vector<int,_std::allocator<int>_> local_6a8;
  ulong local_690;
  ulong local_688;
  long local_680;
  long local_678;
  pointer local_670;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_668;
  vector<char,_std::allocator<char>_> local_650;
  undefined1 local_638 [8];
  undefined1 auStack_630 [8];
  undefined1 local_628 [16];
  _Alloc_hider local_618;
  pointer local_610;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_608 [4];
  ios_base local_5c8 [8];
  ios_base local_5c0 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_5a8;
  undefined1 local_588 [208];
  vector<int,_std::allocator<int>_> local_4b8;
  vector<int,_std::allocator<int>_> local_4a0;
  vector<int,_std::allocator<int>_> local_488;
  vector<int,_std::allocator<int>_> local_470;
  ulong local_458;
  long local_450;
  ulong local_448;
  long *local_440 [2];
  long local_430 [2];
  undefined1 local_420 [16];
  pointer local_410;
  pointer local_408;
  pointer local_400;
  pointer local_3f8;
  ShaderProgram local_3f0;
  undefined1 local_320 [16];
  _func_int *local_310 [12];
  ios_base local_2b0 [264];
  undefined1 local_1a8 [16];
  _func_int *local_198;
  long lStack_190;
  ios_base local_138 [264];
  
  local_768 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  iVar10 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  local_7e0 = CONCAT44(extraout_var,iVar10);
  local_6f8.uniforms.
  super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6f8.uniforms.
  super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6f8.blocks.
  super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6f8.uniforms.
  super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6f8.blocks.
  super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6f8.blocks.
  super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_668.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_668.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_668.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_408 = (pointer)(local_420 + 8);
  local_420._8_4_ = _S_red;
  local_410 = (pointer)0x0;
  local_3f8 = (pointer)0x0;
  local_7e8 = this;
  local_400 = local_408;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  local_718 = (pointer)((ulong)((long)(local_7e8->m_interface).m_uniformBlocks.
                                      super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(local_7e8->m_interface).m_uniformBlocks.
                                     super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (0 < (int)(uint)local_718) {
    local_718 = (pointer)(ulong)((uint)local_718 & 0x7fffffff);
    lVar38 = 0;
    do {
      local_7d8 = (local_7e8->m_interface).m_uniformBlocks.
                  super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar38];
      bVar39 = (local_7d8->m_instanceName)._M_string_length == 0;
      bVar40 = (local_7d8->m_instanceName)._M_dataplus._M_p == (pointer)0x0;
      local_680 = lVar38;
      if (bVar40 || bVar39) {
        pp_Var28 = local_310;
        puVar30 = (undefined8 *)(local_320 + 8);
        local_320._0_8_ = pp_Var28;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_440,(local_7d8->m_blockName)._M_dataplus._M_p,&local_731);
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)local_440);
        local_320._0_8_ = local_310;
        pp_Var28 = (_func_int **)(puVar16 + 2);
        if ((_func_int **)*puVar16 == pp_Var28) {
          local_310[0] = *pp_Var28;
          local_310[1] = (_func_int *)puVar16[3];
        }
        else {
          local_310[0] = *pp_Var28;
          local_320._0_8_ = (_func_int **)*puVar16;
        }
        puVar30 = puVar16 + 1;
        local_320._8_8_ = puVar16[1];
        *puVar16 = pp_Var28;
      }
      pUVar31 = local_7d8;
      *puVar30 = 0;
      *(undefined1 *)pp_Var28 = 0;
      if ((!bVar40 && !bVar39) && (local_440[0] != local_430)) {
        operator_delete(local_440[0],local_430[0] + 1);
      }
      local_710 = (pointer)((long)local_6f8.uniforms.
                                  super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_6f8.uniforms.
                                 super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
      local_7d0._0_8_ = local_7d0._0_8_ & 0xffffffff00000000;
      pUVar36 = (pUVar31->m_uniforms).
                super__Vector_base<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (pUVar36 !=
          (pUVar31->m_uniforms).
          super__Vector_base<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        uVar32 = (long)local_6f8.blocks.
                       super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_6f8.blocks.
                       super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_638 = (undefined1  [8])(auStack_630 + 8);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_638,local_320._0_8_,
                     (undefined1 *)(local_320._8_8_ + local_320._0_8_));
          std::__cxx11::string::append((char *)local_638);
          uVar33 = pUVar36->m_flags;
          uVar26 = uVar33;
          if ((uVar33 & 0x38) == 0) {
            uVar26 = local_7d8->m_flags;
          }
          if ((uVar33 & 0xc0) == 0) {
            uVar33 = local_7d8->m_flags;
          }
          uVar33 = uVar33 & 0xc0 | uVar26 & 0x38;
          in_R9 = (ulong)uVar33;
          ub::anon_unknown_12::computeStd140Layout
                    (&local_6f8,(int *)local_7d0,(int)(uVar32 >> 6),(string *)local_638,
                     &pUVar36->m_type,uVar33);
          if (local_638 != (undefined1  [8])(auStack_630 + 8)) {
            operator_delete((void *)local_638,local_628._0_8_ + 1);
          }
          pUVar36 = pUVar36 + 1;
          pUVar31 = local_7d8;
        } while (pUVar36 !=
                 (local_7d8->m_uniforms).
                 super__Vector_base<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      uVar32 = (long)local_6f8.uniforms.
                     super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_6f8.uniforms.
                     super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      local_710 = (pointer)((ulong)local_710 >> 6);
      local_678 = CONCAT44(local_678._4_4_,local_7d0._0_4_);
      local_73c = pUVar31->m_arraySize;
      if (pUVar31->m_arraySize < 2) {
        local_73c = 1;
      }
      iVar10 = 0;
      do {
        local_638 = (undefined1  [8])(auStack_630 + 8);
        auStack_630 = (undefined1  [8])0x0;
        local_628._0_8_ = local_628._0_8_ & 0xffffffffffffff00;
        local_618._M_p = local_618._M_p & 0xffffffff00000000;
        aaStack_608[0]._8_8_ = (pointer)0x0;
        local_610 = (pointer)0x0;
        aaStack_608[0]._M_allocated_capacity = (pointer)0x0;
        std::
        vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>::
        emplace_back<deqp::gls::ub::BlockLayoutEntry>
                  (&local_6f8.blocks,(BlockLayoutEntry *)local_638);
        if (local_610 != (pointer)0x0) {
          operator_delete(local_610,aaStack_608[0]._8_8_ - (long)local_610);
        }
        local_738 = iVar10;
        if (local_638 != (undefined1  [8])(auStack_630 + 8)) {
          operator_delete((void *)local_638,local_628._0_8_ + 1);
        }
        pBVar20 = local_6f8.blocks.
                  super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pBVar21 = local_6f8.blocks.
                  super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -1;
        __s._M_p = (pUVar31->m_blockName)._M_dataplus._M_p;
        pcVar22 = (char *)local_6f8.blocks.
                          super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-1].name._M_string_length;
        strlen(__s._M_p);
        local_670 = pBVar21;
        std::__cxx11::string::_M_replace((ulong)pBVar21,0,pcVar22,(ulong)__s._M_p);
        iVar10 = local_738;
        pBVar20[-1].size = (int)local_678;
        local_638._0_4_ = (int)local_710;
        iVar27 = (int)(uVar32 >> 6);
        if ((int)local_710 < iVar27) {
          pUVar17 = local_710;
          do {
            __position._M_current =
                 pBVar20[-1].activeUniformIndices.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                pBVar20[-1].activeUniformIndices.super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&pBVar20[-1].activeUniformIndices,
                         __position,(int *)local_638);
            }
            else {
              *__position._M_current = (int)pUVar17;
              pBVar20[-1].activeUniformIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl
              .super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            uVar33 = local_638._0_4_ + 1;
            pUVar17 = (pointer)(ulong)uVar33;
            local_638._0_4_ = uVar33;
          } while ((int)uVar33 < iVar27);
        }
        pppSVar1 = &local_3f0.m_shaders[0].
                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        if (0 < local_7d8->m_arraySize) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_638);
          std::ostream::operator<<((BlockLayoutEntry *)local_638,iVar10);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_638);
          std::ios_base::~ios_base(local_5c8);
          plVar18 = (long *)std::__cxx11::string::replace((ulong)local_798,0,(char *)0x0,0x1cd140e);
          plVar29 = plVar18 + 2;
          if ((pointer *)*plVar18 == (pointer *)plVar29) {
            local_3f0.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar29;
            local_3f0.m_shaders[1].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar18[3];
            local_3f0.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)pppSVar1;
          }
          else {
            local_3f0.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar29;
            local_3f0.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar18;
          }
          local_3f0.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)plVar18[1];
          *plVar18 = (long)plVar29;
          plVar18[1] = 0;
          *(undefined1 *)(plVar18 + 2) = 0;
          plVar18 = (long *)std::__cxx11::string::append((char *)&local_3f0);
          pp_Var28 = (_func_int **)(plVar18 + 2);
          if ((_func_int **)*plVar18 == pp_Var28) {
            local_198 = *pp_Var28;
            lStack_190 = plVar18[3];
            local_1a8._0_8_ = &local_198;
          }
          else {
            local_198 = *pp_Var28;
            local_1a8._0_8_ = (_func_int **)*plVar18;
          }
          local_1a8._8_8_ = plVar18[1];
          *plVar18 = (long)pp_Var28;
          plVar18[1] = 0;
          *(undefined1 *)(plVar18 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_670,local_1a8._0_8_);
          if ((_func_int **)local_1a8._0_8_ != &local_198) {
            operator_delete((void *)local_1a8._0_8_,(ulong)(local_198 + 1));
          }
          if (local_3f0.m_shaders[0].
              super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)pppSVar1) {
            operator_delete(local_3f0.m_shaders[0].
                            super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_3f0.m_shaders[0].
                                  super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
          }
          if ((undefined1 *)local_798._0_8_ != local_798 + 0x10) {
            operator_delete((void *)local_798._0_8_,local_798._16_8_ + 1);
          }
        }
        iVar10 = iVar10 + 1;
        pUVar31 = local_7d8;
      } while (iVar10 != local_73c);
      if ((_func_int **)local_320._0_8_ != local_310) {
        operator_delete((void *)local_320._0_8_,(ulong)(local_310[0] + 1));
      }
      lVar38 = local_680 + 1;
    } while ((pointer)lVar38 != local_718);
  }
  uVar32 = 0;
  pBVar21 = local_6f8.blocks.
            super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_6f8.blocks.
      super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_6f8.blocks.
      super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      uVar33 = (int)uVar32 + pBVar21->size;
      uVar32 = (ulong)uVar33;
      pBVar21 = pBVar21 + 1;
    } while (pBVar21 !=
             local_6f8.blocks.
             super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    uVar32 = (ulong)(int)uVar33;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_668,uVar32);
  local_638 = (undefined1  [8])((ulong)local_638 & 0xffffffff00000000);
  if (0 < (int)((ulong)((long)local_6f8.blocks.
                              super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_6f8.blocks.
                             super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 6)) {
    iVar10 = 0;
    do {
      puVar8 = local_668.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      ppvVar19 = std::
                 map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>::
                 operator[]((map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                             *)local_420,(key_type_conflict *)local_638);
      *ppvVar19 = puVar8 + iVar10;
      iVar27 = local_638._0_4_ + 1;
      iVar10 = iVar10 + local_6f8.blocks.
                        super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start[(int)local_638._0_4_].size;
      local_638._0_4_ = iVar27;
    } while (iVar27 < (int)((ulong)((long)local_6f8.blocks.
                                          super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_6f8.blocks.
                                         super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 6));
  }
  deRandom_init((deRandom *)local_638,1);
  local_690 = (ulong)((long)local_6f8.blocks.
                            super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_6f8.blocks.
                           super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 6;
  if (0 < (int)(uint)local_690) {
    local_690 = (ulong)((uint)local_690 & 0x7fffffff);
    uVar32 = 0;
    do {
      pBVar37 = (pointer)(local_420 + 8);
      pBVar20 = pBVar37;
      for (pBVar21 = local_410; pBVar21 != (pointer)0x0;
          pBVar21 = *(pointer *)
                     ((long)&(pBVar21->name).field_2 +
                     (ulong)((long)pBVar21->size < (long)uVar32) * 8)) {
        if ((long)uVar32 <= (long)pBVar21->size) {
          pBVar20 = pBVar21;
        }
      }
      pBVar21 = pBVar37;
      if ((pBVar20 != pBVar37) && (pBVar21 = pBVar20, (long)uVar32 < (long)pBVar20->size)) {
        pBVar21 = pBVar37;
      }
      local_458 = uVar32;
      local_450 = uVar32 * 0x40;
      local_688 = (ulong)((long)local_6f8.blocks.
                                super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar32].
                                activeUniformIndices.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_6f8.blocks.
                               super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar32].
                               activeUniformIndices.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 2;
      uVar33 = (uint)local_688;
      if (0 < (int)uVar33) {
        local_718 = (pBVar21->activeUniformIndices).super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        local_688 = (ulong)(uVar33 & 0x7fffffff);
        uVar32 = 0;
        do {
          pUVar17 = local_6f8.uniforms.
                    super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          iVar10 = *(int *)(*(long *)((long)&((local_6f8.blocks.
                                               super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             activeUniformIndices).
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start + local_450) +
                           uVar32 * 4);
          DVar11 = glu::getDataTypeScalarType
                             (local_6f8.uniforms.
                              super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                              ._M_impl.super__Vector_impl_data._M_start[iVar10].type);
          pUVar17 = pUVar17 + iVar10;
          iVar10 = glu::getDataTypeScalarSize(pUVar17->type);
          DVar15 = pUVar17->type;
          bVar39 = DVar15 - TYPE_FLOAT_MAT2 < 9;
          bVar40 = DVar15 - TYPE_DOUBLE_MAT2 < 9;
          local_7d8 = (UniformBlock *)CONCAT44(local_7d8._4_4_,1);
          local_738 = CONCAT31(local_738._1_3_,bVar40 || bVar39);
          if (bVar40 || bVar39) {
            if (pUVar17->isRowMajor == true) {
              iVar27 = glu::getDataTypeMatrixNumRows(DVar15);
              local_7d8 = (UniformBlock *)CONCAT44(local_7d8._4_4_,iVar27);
            }
            else {
              iVar27 = glu::getDataTypeMatrixNumColumns(DVar15);
              local_7d8 = (UniformBlock *)CONCAT44(local_7d8._4_4_,iVar27);
            }
          }
          local_448 = uVar32;
          local_680 = CONCAT44(local_680._4_4_,pUVar17->size);
          if (0 < pUVar17->size) {
            pBVar21 = (pointer)((long)iVar10 / (long)(int)local_7d8 & 0xffffffff);
            local_670 = pBVar21;
            iVar10 = 0;
            local_710 = pUVar17;
            do {
              local_73c = iVar10;
              iVar10 = pUVar17->arrayStride * iVar10;
              if ((int)local_680 < 2) {
                iVar10 = 0;
              }
              if (0 < (int)local_7d8) {
                local_678 = (long)local_718 + (long)iVar10 + (long)pUVar17->offset;
                iVar10 = 0;
                do {
                  lVar38 = (long)(pUVar17->matrixStride * iVar10);
                  if ((char)local_738 == '\0') {
                    lVar38 = 0;
                  }
                  if (0 < (int)local_670) {
                    lVar38 = lVar38 + local_678;
                    lVar34 = 0;
                    do {
                      if ((int)DVar11 < 0x1f) {
                        if (DVar11 == TYPE_FLOAT) {
                          dVar12 = deRandom_getUint32((deRandom *)local_638);
                          *(float *)(lVar38 + (int)lVar34) = (float)(int)(dVar12 % 0x13 - 9);
                        }
                        else if (DVar11 == TYPE_INT) {
                          dVar12 = deRandom_getUint32((deRandom *)local_638);
                          uVar33 = dVar12 % 0x13 - 9;
                          goto LAB_01888938;
                        }
                      }
                      else {
                        if (DVar11 == TYPE_UINT) {
                          dVar12 = deRandom_getUint32((deRandom *)local_638);
                          uVar33 = dVar12 % 10;
                        }
                        else {
                          if (DVar11 != TYPE_BOOL) goto LAB_0188893d;
                          dVar13 = deRandom_getBool((deRandom *)local_638);
                          uVar33 = 0;
                          if (dVar13 == 1) {
                            dVar12 = deRandom_getUint32((deRandom *)local_638);
                            uVar33 = dVar12 | 1;
                          }
                        }
LAB_01888938:
                        *(uint *)(lVar38 + (int)lVar34) = uVar33;
                      }
LAB_0188893d:
                      lVar34 = lVar34 + 4;
                    } while ((long)pBVar21 * 4 - lVar34 != 0);
                  }
                  iVar10 = iVar10 + 1;
                  pUVar17 = local_710;
                } while (iVar10 != (int)local_7d8);
              }
              iVar10 = local_73c + 1;
            } while (iVar10 < pUVar17->size);
          }
          uVar32 = local_448 + 1;
        } while (uVar32 != local_688);
      }
      uVar32 = local_458 + 1;
    } while (uVar32 != local_690);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pcVar22 = glu::getGLSLVersionDeclaration(local_7e8->m_glslVersion);
  if (pcVar22 == (char *)0x0) {
    std::ios::clear((int)&local_7f8 + (int)*(_func_int **)(local_320._0_8_ + -0x18) + 0x4d8);
  }
  else {
    sVar23 = strlen(pcVar22);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar22,sVar23);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"in highp vec4 a_position;\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"out mediump float v_vtxResult;\n",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\n",1);
  this_00 = &local_7e8->m_interface;
  local_638 = (undefined1  [8])0x0;
  auStack_630 = (undefined1  [8])0x0;
  local_628._0_8_ = 0;
  ub::ShaderInterface::getNamedStructs
            (this_00,(vector<const_deqp::gls::ub::StructType_*,_std::allocator<const_deqp::gls::ub::StructType_*>_>
                      *)local_638);
  if (local_638 != auStack_630) {
    auVar35 = local_638;
    do {
      ub::anon_unknown_12::generateFullDeclaration
                ((ostringstream *)local_320,*(StructType **)auVar35,0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,";\n",2);
      auVar35 = (undefined1  [8])((long)auVar35 + 8);
    } while (auVar35 != auStack_630);
  }
  ppUVar24 = (local_7e8->m_interface).m_uniformBlocks.
             super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(local_7e8->m_interface).m_uniformBlocks.
                              super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppUVar24) >> 3)) {
    lVar38 = 0;
    do {
      if ((ppUVar24[lVar38]->m_flags & 0x100) != 0) {
        ub::anon_unknown_12::generateDeclaration((ostringstream *)local_320,ppUVar24[lVar38]);
      }
      lVar38 = lVar38 + 1;
      ppUVar24 = (local_7e8->m_interface).m_uniformBlocks.
                 super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar38 < (int)((ulong)((long)(local_7e8->m_interface).m_uniformBlocks.
                                          super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)ppUVar24) >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\n",1);
  ub::anon_unknown_12::generateCompareFuncs((ostream *)local_320,this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,
             "\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tmediump float result = 1.0;\n",
             0x4c);
  ub::anon_unknown_12::generateCompareSrc
            ((ostringstream *)local_320,(char *)this_00,(ShaderInterface *)&local_6f8,
             (UniformLayout *)local_420,
             (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> *)
             &DAT_00000001,SUB81(in_R9,0));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"\tv_vtxResult = result;\n}\n",0x19);
  if (local_638 != (undefined1  [8])0x0) {
    operator_delete((void *)local_638,local_628._0_8_ - (long)local_638);
  }
  pcVar22 = glu::getGLSLVersionDeclaration(local_7e8->m_glslVersion);
  if (pcVar22 == (char *)0x0) {
    std::ios::clear((int)&local_7f8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x650);
  }
  else {
    sVar23 = strlen(pcVar22);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar22,sVar23);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"in mediump float v_vtxResult;\n",0x1e);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) out mediump vec4 dEQP_FragColor;\n",0x36);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  local_638 = (undefined1  [8])0x0;
  auStack_630 = (undefined1  [8])0x0;
  local_628._0_8_ = 0;
  ub::ShaderInterface::getNamedStructs
            (this_00,(vector<const_deqp::gls::ub::StructType_*,_std::allocator<const_deqp::gls::ub::StructType_*>_>
                      *)local_638);
  if (local_638 != auStack_630) {
    auVar35 = local_638;
    do {
      ub::anon_unknown_12::generateFullDeclaration
                ((ostringstream *)local_1a8,(StructType *)((TestLog *)auVar35)->m_log,0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";\n",2);
      auVar35 = (undefined1  [8])((long)auVar35 + 8);
    } while (auVar35 != auStack_630);
  }
  isVertex = (undefined1)in_R9;
  ppUVar24 = (local_7e8->m_interface).m_uniformBlocks.
             super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(local_7e8->m_interface).m_uniformBlocks.
                              super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppUVar24) >> 3)) {
    lVar38 = 0;
    do {
      if ((ppUVar24[lVar38]->m_flags & 0x200) != 0) {
        ub::anon_unknown_12::generateDeclaration((ostringstream *)local_1a8,ppUVar24[lVar38]);
      }
      isVertex = (undefined1)in_R9;
      lVar38 = lVar38 + 1;
      ppUVar24 = (local_7e8->m_interface).m_uniformBlocks.
                 super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar38 < (int)((ulong)((long)(local_7e8->m_interface).m_uniformBlocks.
                                          super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)ppUVar24) >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  ub::anon_unknown_12::generateCompareFuncs((ostream *)local_1a8,this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\nvoid main (void)\n{\n\tmediump float result = 1.0;\n",0x31);
  ub::anon_unknown_12::generateCompareSrc
            ((ostringstream *)local_1a8,(char *)this_00,(ShaderInterface *)&local_6f8,
             (UniformLayout *)local_420,
             (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> *)0x0
             ,(bool)isVertex);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\tdEQP_FragColor = vec4(1.0, v_vtxResult, result, 1.0);\n}\n",
             0x39);
  if (local_638 != (undefined1  [8])0x0) {
    operator_delete((void *)local_638,local_628._0_8_ - (long)local_638);
  }
  renderCtx = local_7e8->m_renderCtx;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  local_588[0x10] = 0;
  local_588._17_8_ = 0;
  local_588._0_8_ = (pointer)0x0;
  local_588[8] = 0;
  local_588._9_7_ = 0;
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_638,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_638,(value_type *)local_798);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_628 + 8),(value_type *)local_7d0);
  glu::ShaderProgram::ShaderProgram(&local_3f0,renderCtx,(ProgramSources *)local_638);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_588);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_5a8);
  lVar38 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_638 + lVar38));
    lVar38 = lVar38 + -0x18;
  } while (lVar38 != -0x18);
  if ((undefined1 *)local_7d0._0_8_ != local_7d0 + 0x10) {
    operator_delete((void *)local_7d0._0_8_,local_7d0._16_8_ + 1);
  }
  lVar38 = local_7e0;
  if ((undefined1 *)local_798._0_8_ != local_798 + 0x10) {
    operator_delete((void *)local_798._0_8_,local_798._16_8_ + 1);
  }
  glu::operator<<(local_768,&local_3f0);
  dVar12 = local_3f0.m_program.m_program;
  if (local_3f0.m_program.m_info.linkOk == false) {
    tcu::TestContext::setTestResult
              ((local_7e8->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Compile failed");
  }
  else {
    vStack_780.
    super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_780.
    super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_798._16_8_ = 0;
    vStack_780.
    super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_798._0_8_ = (pointer)0x0;
    local_798._8_8_ = (pointer)0x0;
    local_7ec = 0;
    local_79c = 0;
    (**(code **)(lVar38 + 0x9d8))(local_3f0.m_program.m_program,0x8b86);
    (**(code **)(lVar38 + 0x9d8))(dVar12,0x8a36,&local_79c);
    dVar14 = (**(code **)(lVar38 + 0x800))();
    glu::checkError(dVar14,"Failed to get number of uniforms and uniform blocks",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
                    ,0x497);
    std::vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>::
    resize((vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
            *)local_798,(long)local_79c);
    if (0 < local_79c) {
      lVar38 = 0x28;
      uVar32 = 0;
      do {
        uVar7 = local_798._0_8_;
        lVar34 = local_7e0;
        (**(code **)(local_7e0 + 0x760))(dVar12,uVar32 & 0xffffffff,0x8a40,&local_760);
        (**(code **)(lVar34 + 0x760))(dVar12,uVar32 & 0xffffffff,0x8a41,&local_730);
        (**(code **)(lVar34 + 0x760))(dVar12,uVar32 & 0xffffffff,0x8a42,&local_6a8);
        dVar14 = (**(code **)(lVar34 + 0x800))();
        glu::checkError(dVar14,"Uniform block query failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
                        ,0x4a6);
        uVar33 = (uint)local_730.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
        if ((int)(uint)local_730.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start < 2) {
          uVar33 = 1;
        }
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)local_7d0,(ulong)uVar33,
                   (allocator_type *)local_638);
        (**(code **)(local_7e0 + 0x758))
                  (dVar12,uVar32 & 0xffffffff,local_7d0._8_4_ - (int)local_7d0._0_8_,0);
        uVar6 = local_7d0._0_8_;
        local_638 = (undefined1  [8])(auStack_630 + 8);
        if ((char *)local_7d0._0_8_ == (char *)0x0) {
          pcVar22 = &DAT_00000001;
        }
        else {
          sVar23 = strlen((char *)local_7d0._0_8_);
          pcVar22 = (char *)(uVar6 + sVar23);
        }
        std::__cxx11::string::_M_construct<char_const*>((string *)local_638,uVar6,pcVar22);
        std::__cxx11::string::operator=((string *)(uVar7 + lVar38 + -0x28),(string *)local_638);
        if (local_638 != (undefined1  [8])(auStack_630 + 8)) {
          operator_delete((void *)local_638,local_628._0_8_ + 1);
        }
        *(undefined4 *)(uVar7 + lVar38 + -8) = local_760._M_dataplus._M_p._0_4_;
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)(uVar7 + lVar38),
                   (long)(int)local_6a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
        if (0 < (int)local_6a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start) {
          (**(code **)(local_7e0 + 0x760))
                    (dVar12,uVar32 & 0xffffffff,0x8a43,
                     (((vector<int,_std::allocator<int>_> *)(uVar7 + lVar38))->
                     super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                     _M_start);
        }
        dVar14 = (**(code **)(local_7e0 + 0x800))();
        glu::checkError(dVar14,"Uniform block query failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
                        ,0x4b3);
        if ((char *)local_7d0._0_8_ != (char *)0x0) {
          operator_delete((void *)local_7d0._0_8_,local_7d0._16_8_ - local_7d0._0_8_);
        }
        uVar32 = uVar32 + 1;
        lVar38 = lVar38 + 0x40;
      } while ((long)uVar32 < (long)local_79c);
    }
    lVar38 = local_7e0;
    if (0 < (long)local_7ec) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7d0,(long)local_7ec,
                 (allocator_type *)local_638);
      if (0 < local_7ec) {
        lVar34 = 0;
        do {
          *(int *)(local_7d0._0_8_ + lVar34 * 4) = (int)lVar34;
          lVar34 = lVar34 + 1;
        } while (lVar34 < local_7ec);
      }
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_760,(long)local_7ec,
                 (allocator_type *)local_638);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_730,(long)local_7ec,(allocator_type *)local_638);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_6a8,(long)local_7ec,(allocator_type *)local_638);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_6c0,(long)local_7ec,(allocator_type *)local_638);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_470,(long)local_7ec,(allocator_type *)local_638);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_488,(long)local_7ec,(allocator_type *)local_638);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_4a0,(long)local_7ec,(allocator_type *)local_638);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_4b8,(long)local_7ec,(allocator_type *)local_638);
      (**(code **)(lVar38 + 0x770))
                (dVar12,(ulong)(CONCAT44(local_7d0._12_4_,local_7d0._8_4_) - local_7d0._0_8_) >> 2,
                 local_7d0._0_8_,0x8a37,local_760._M_dataplus._M_p);
      (**(code **)(lVar38 + 0x770))
                (dVar12,(ulong)(CONCAT44(local_7d0._12_4_,local_7d0._8_4_) - local_7d0._0_8_) >> 2,
                 local_7d0._0_8_,0x8a38,
                 CONCAT44(local_730.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          (uint)local_730.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start));
      (**(code **)(lVar38 + 0x770))
                (dVar12,(ulong)(CONCAT44(local_7d0._12_4_,local_7d0._8_4_) - local_7d0._0_8_) >> 2,
                 local_7d0._0_8_,0x8a39,
                 CONCAT44(local_6a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          (int)local_6a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start));
      (**(code **)(lVar38 + 0x770))
                (dVar12,(ulong)(CONCAT44(local_7d0._12_4_,local_7d0._8_4_) - local_7d0._0_8_) >> 2,
                 local_7d0._0_8_,0x8a3a,
                 CONCAT44(local_6c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          (int)local_6c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start));
      (**(code **)(lVar38 + 0x770))
                (dVar12,(ulong)(CONCAT44(local_7d0._12_4_,local_7d0._8_4_) - local_7d0._0_8_) >> 2,
                 local_7d0._0_8_,0x8a3b,
                 local_470.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      (**(code **)(lVar38 + 0x770))
                (dVar12,(ulong)(CONCAT44(local_7d0._12_4_,local_7d0._8_4_) - local_7d0._0_8_) >> 2,
                 local_7d0._0_8_,0x8a3c,
                 local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      (**(code **)(lVar38 + 0x770))
                (dVar12,(ulong)(CONCAT44(local_7d0._12_4_,local_7d0._8_4_) - local_7d0._0_8_) >> 2,
                 local_7d0._0_8_,0x8a3d,
                 local_4a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      (**(code **)(lVar38 + 0x770))
                (dVar12,(ulong)(CONCAT44(local_7d0._12_4_,local_7d0._8_4_) - local_7d0._0_8_) >> 2,
                 local_7d0._0_8_,0x8a3e,
                 local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      dVar14 = (**(code **)(lVar38 + 0x800))();
      glu::checkError(dVar14,"Active uniform query failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
                      ,0x4d0);
      std::
      vector<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
      ::resize(&vStack_780,(long)local_7ec);
      if (0 < local_7ec) {
        lVar38 = 0;
        uVar32 = 0;
        do {
          pUVar17 = vStack_780.
                    super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          std::vector<char,_std::allocator<char>_>::vector
                    (&local_650,
                     (long)*(int *)(CONCAT44(local_6a8.super__Vector_base<int,_std::allocator<int>_>
                                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                             (int)local_6a8.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start) +
                                   uVar32 * 4),(allocator_type *)local_638);
          local_6fc = 0;
          local_700 = 0;
          local_704 = 0;
          local_7f8 = local_650.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start;
          (**(code **)(local_7e0 + 0x750))
                    (dVar12,uVar32 & 0xffffffff,
                     (int)local_650.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                     (int)local_650.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,&local_6fc,&local_700,&local_704);
          dVar14 = (**(code **)(local_7e0 + 0x800))();
          glu::checkError(dVar14,"Uniform name query failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
                          ,0x4de);
          pcVar9 = local_650.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (((local_6fc + 1 !=
                *(int *)(CONCAT44(local_6a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._4_4_,
                                  (int)local_6a8.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start) + uVar32 * 4)) ||
              (local_700 !=
               *(int *)(CONCAT44(local_730.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start._4_4_,
                                 (uint)local_730.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start) + uVar32 * 4))) ||
             (local_704 != *(int *)(local_760._M_dataplus._M_p + uVar32 * 4))) {
            this_01 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_01,
                       "Values returned by glGetActiveUniform() don\'t match with values queried with glGetActiveUniformsiv()."
                       ,(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
                       ,0x4e4);
            __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          local_638 = (undefined1  [8])(auStack_630 + 8);
          if (local_650.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start == (char *)0x0) {
            pcVar22 = &DAT_00000001;
          }
          else {
            sVar23 = strlen(local_650.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
            pcVar22 = pcVar9 + sVar23;
          }
          std::__cxx11::string::_M_construct<char_const*>((string *)local_638,pcVar9,pcVar22);
          std::__cxx11::string::operator=((string *)((long)pUVar17 + lVar38),(string *)local_638);
          if (local_638 != (undefined1  [8])(auStack_630 + 8)) {
            operator_delete((void *)local_638,local_628._0_8_ + 1);
          }
          DVar15 = glu::getDataTypeFromGLType
                             (*(deUint32 *)(local_760._M_dataplus._M_p + uVar32 * 4));
          *(DataType *)((long)pUVar17 + 0x20 + lVar38) = DVar15;
          *(undefined4 *)((long)pUVar17 + 0x24 + lVar38) =
               *(undefined4 *)
                (CONCAT44(local_730.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          (uint)local_730.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start) + uVar32 * 4);
          *(undefined4 *)((long)pUVar17 + 0x28 + lVar38) =
               *(undefined4 *)
                (CONCAT44(local_6c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          (int)local_6c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start) + uVar32 * 4);
          *(int *)((long)pUVar17 + 0x2c + lVar38) =
               local_470.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar32];
          *(int *)((long)pUVar17 + 0x30 + lVar38) =
               local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar32];
          *(int *)((long)pUVar17 + 0x34 + lVar38) =
               local_4a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar32];
          *(bool *)((long)pUVar17 + 0x38 + lVar38) =
               local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar32] != 0;
          if (local_650.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start != (char *)0x0) {
            operator_delete(local_650.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_650.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_650.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          uVar32 = uVar32 + 1;
          lVar38 = lVar38 + 0x40;
        } while ((long)uVar32 < (long)local_7ec);
      }
      if (local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_4a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_4a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_4a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_4a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_470.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_470.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_470.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_470.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      pvVar4 = (void *)CONCAT44(local_6c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                (int)local_6c0.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start);
      if (pvVar4 != (void *)0x0) {
        operator_delete(pvVar4,(long)local_6c0.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_end_of_storage - (long)pvVar4);
      }
      pvVar4 = (void *)CONCAT44(local_6a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                (int)local_6a8.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start);
      if (pvVar4 != (void *)0x0) {
        operator_delete(pvVar4,(long)local_6a8.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_end_of_storage - (long)pvVar4);
      }
      pvVar4 = (void *)CONCAT44(local_730.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                (uint)local_730.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
      if (pvVar4 != (void *)0x0) {
        operator_delete(pvVar4,(long)local_730.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_end_of_storage - (long)pvVar4);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_760._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_760._M_dataplus._M_p,
                        local_760.field_2._M_allocated_capacity - (long)local_760._M_dataplus._M_p);
      }
      if ((char *)local_7d0._0_8_ != (char *)0x0) {
        operator_delete((void *)local_7d0._0_8_,local_7d0._16_8_ - local_7d0._0_8_);
      }
    }
    local_7d0._0_8_ = local_7d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_7d0,"ActiveUniformBlocks","");
    local_760._M_dataplus._M_p = (pointer)&local_760.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_760,"Active Uniform Blocks","")
    ;
    tcu::LogSection::LogSection((LogSection *)local_638,(string *)local_7d0,&local_760);
    tcu::TestLog::startSection(local_768,(char *)local_638,local_618._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_618._M_p != aaStack_608) {
      operator_delete(local_618._M_p,(ulong)(aaStack_608[0]._M_allocated_capacity + 1));
    }
    if (local_638 != (undefined1  [8])(auStack_630 + 8)) {
      operator_delete((void *)local_638,local_628._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_760._M_dataplus._M_p != &local_760.field_2) {
      operator_delete(local_760._M_dataplus._M_p,local_760.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_7d0._0_8_ != local_7d0 + 0x10) {
      operator_delete((void *)local_7d0._0_8_,local_7d0._16_8_ + 1);
    }
    if (0 < (int)((ulong)(local_798._8_8_ - local_798._0_8_) >> 6)) {
      lVar34 = 0;
      lVar38 = 0;
      do {
        local_638 = (undefined1  [8])local_768;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_630);
        std::ostream::operator<<((ostringstream *)auStack_630,(int)lVar38);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_630,": ",2);
        ub::operator<<((ostream *)auStack_630,(BlockLayoutEntry *)(local_798._0_8_ + lVar34));
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_638,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_630);
        std::ios_base::~ios_base(local_5c0);
        lVar38 = lVar38 + 1;
        lVar34 = lVar34 + 0x40;
      } while (lVar38 < (int)((ulong)(local_798._8_8_ - local_798._0_8_) >> 6));
    }
    tcu::TestLog::endSection(local_768);
    local_7d0._0_8_ = local_7d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_7d0,"ActiveUniforms","");
    local_760._M_dataplus._M_p = (pointer)&local_760.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_760,"Active Uniforms","");
    tcu::LogSection::LogSection((LogSection *)local_638,(string *)local_7d0,&local_760);
    tcu::TestLog::startSection(local_768,(char *)local_638,local_618._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_618._M_p != aaStack_608) {
      operator_delete(local_618._M_p,(ulong)(aaStack_608[0]._M_allocated_capacity + 1));
    }
    if (local_638 != (undefined1  [8])(auStack_630 + 8)) {
      operator_delete((void *)local_638,local_628._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_760._M_dataplus._M_p != &local_760.field_2) {
      operator_delete(local_760._M_dataplus._M_p,local_760.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_7d0._0_8_ != local_7d0 + 0x10) {
      operator_delete((void *)local_7d0._0_8_,local_7d0._16_8_ + 1);
    }
    if (0 < (int)((ulong)((long)vStack_780.
                                super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)vStack_780.
                               super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 6)) {
      lVar34 = 0;
      lVar38 = 0;
      do {
        local_638 = (undefined1  [8])local_768;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_630);
        std::ostream::operator<<((ostringstream *)auStack_630,(int)lVar38);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_630,": ",2);
        ub::operator<<((ostream *)auStack_630,
                       (UniformLayoutEntry *)
                       ((long)vStack_780.
                              super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar34));
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_638,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_630);
        std::ios_base::~ios_base(local_5c0);
        lVar38 = lVar38 + 1;
        lVar34 = lVar34 + 0x40;
      } while (lVar38 < (int)((ulong)((long)vStack_780.
                                            super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)vStack_780.
                                           super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 6));
    }
    tcu::TestLog::endSection(local_768);
    lVar38 = local_7e0;
    bVar39 = checkLayoutIndices(local_7e8,(UniformLayout *)local_798);
    if (((bVar39) && (bVar39 = checkLayoutBounds(local_7e8,(UniformLayout *)local_798), bVar39)) &&
       (bVar39 = compareTypes(local_7e8,&local_6f8,(UniformLayout *)local_798), bVar39)) {
      bVar39 = compareStd140Blocks(local_7e8,&local_6f8,(UniformLayout *)local_798);
      if (!bVar39) {
        tcu::TestContext::setTestResult
                  ((local_7e8->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                   "Invalid std140 layout");
      }
      bVar39 = compareSharedBlocks(local_7e8,&local_6f8,(UniformLayout *)local_798);
      if (!bVar39) {
        tcu::TestContext::setTestResult
                  ((local_7e8->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                   "Invalid shared layout");
      }
      bVar39 = checkIndexQueries(local_7e8,local_3f0.m_program.m_program,(UniformLayout *)local_798)
      ;
      if (!bVar39) {
        tcu::TestContext::setTestResult
                  ((local_7e8->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                   "Inconsintent block index query results");
      }
      (**(code **)(lVar38 + 0x1680))(local_3f0.m_program.m_program);
      if (0 < (int)((ulong)(local_798._8_8_ - local_798._0_8_) >> 6)) {
        iVar10 = 0;
        do {
          (**(code **)(local_7e0 + 0x15d0))(local_3f0.m_program.m_program,iVar10,iVar10);
          iVar10 = iVar10 + 1;
        } while (iVar10 < (int)((ulong)(local_798._8_8_ - local_798._0_8_) >> 6));
      }
      lVar38 = local_7e0;
      dVar12 = (**(code **)(local_7e0 + 0x800))();
      glu::checkError(dVar12,"Failed to set uniform block bindings",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
                      ,0x5cf);
      local_760._M_dataplus._M_p = (pointer)local_7e8->m_renderCtx;
      local_760._M_string_length = 0;
      local_760.field_2._M_allocated_capacity = 0;
      local_760.field_2._8_8_ = 0;
      uVar33 = (uint)((ulong)(local_798._8_8_ - local_798._0_8_) >> 6);
      if (local_7e8->m_bufferMode == BUFFERMODE_PER_BLOCK) {
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)local_7d0,(long)(int)uVar33,(allocator_type *)local_638);
        local_628._8_8_ = auStack_630;
        auStack_630 = (undefined1  [8])((ulong)auStack_630 & 0xffffffff00000000);
        local_628._0_8_ = 0;
        local_610 = (pointer)0x0;
        local_730.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = 0;
        local_618._M_p = (pointer)local_628._8_8_;
        if (0 < (int)uVar33) {
          do {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       (local_7d0._0_8_ +
                       (long)(int)(uint)local_730.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start * 0x18),
                       (long)*(int *)(local_798._0_8_ +
                                     (long)(int)(uint)local_730.
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl.super__Vector_impl_data._M_start *
                                     0x40 + 0x20));
            pvVar2 = *(mapped_type *)
                      (local_7d0._0_8_ +
                      (long)(int)(uint)local_730.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start * 0x18);
            ppvVar19 = std::
                       map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                       ::operator[]((map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                                     *)local_638,(key_type_conflict *)&local_730);
            *ppvVar19 = pvVar2;
            local_730.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start._0_4_ =
                 (uint)local_730.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + 1;
          } while ((int)(uint)local_730.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start < (int)uVar33);
        }
        ub::anon_unknown_12::copyUniformData
                  ((UniformLayout *)local_798,
                   (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                    *)local_638,&local_6f8,
                   (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                    *)local_420);
        if (0 < (int)uVar33) {
          lVar38 = 8;
          uVar32 = 0;
          do {
            dVar12 = ub::UniformBufferManager::allocBuffer((UniformBufferManager *)&local_760);
            (**(code **)(local_7e0 + 0x40))(0x8a11,dVar12);
            (**(code **)(local_7e0 + 0x150))
                      (0x8a11,*(long *)(local_7d0._0_8_ + lVar38) -
                              *(long *)(local_7d0._0_8_ + lVar38 + -8),
                       *(long *)(local_7d0._0_8_ + lVar38 + -8),0x88e4);
            dVar14 = (**(code **)(local_7e0 + 0x800))();
            glu::checkError(dVar14,"Failed to upload uniform buffer data",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
                            ,0x5e8);
            (**(code **)(local_7e0 + 0x48))(0x8a11,uVar32 & 0xffffffff,dVar12);
            dVar12 = (**(code **)(local_7e0 + 0x800))();
            glu::checkError(dVar12,"glBindBufferBase(GL_UNIFORM_BUFFER) failed",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
                            ,0x5eb);
            uVar32 = uVar32 + 1;
            lVar38 = lVar38 + 0x18;
          } while ((uVar33 & 0x7fffffff) != uVar32);
        }
        std::
        _Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
        ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                     *)local_638);
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)local_7d0);
      }
      else {
        local_6a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = 0;
        local_628._8_8_ = auStack_630;
        auStack_630 = (undefined1  [8])((ulong)auStack_630 & 0xffffffff00000000);
        local_628._0_8_ = 0;
        local_610 = (pointer)0x0;
        local_618._M_p = (pointer)local_628._8_8_;
        (**(code **)(lVar38 + 0x868))(0x8a34);
        local_7d0._0_8_ = local_7d0._0_8_ & 0xffffffff00000000;
        uVar32 = 0;
        if (0 < (int)uVar33) {
          do {
            iVar10 = (int)uVar32;
            if ((0 < (int)local_6a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) &&
               ((iVar10 / (int)local_6a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start) *
                (int)local_6a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start != iVar10)) {
              iVar10 = (iVar10 / (int)local_6a8.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start + 1) *
                       (int)local_6a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
            }
            pmVar25 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)local_638,(key_type_conflict *)local_7d0);
            *pmVar25 = iVar10;
            lVar38 = (long)(int)local_7d0._0_4_;
            iVar27 = local_7d0._0_4_ + 1;
            uVar32 = (ulong)(uint)(iVar10 + *(int *)(local_798._0_8_ + lVar38 * 0x40 + 0x20));
            local_7d0._0_4_ = iVar27;
          } while (iVar27 < (int)uVar33);
          uVar32 = (ulong)(iVar10 + *(int *)(local_798._0_8_ + lVar38 * 0x40 + 0x20));
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_730,uVar32,
                   (allocator_type *)local_7d0);
        local_7d0._24_8_ = local_7d0 + 8;
        local_7d0._8_4_ = _S_red;
        local_7d0._16_8_ = 0;
        local_7a8 = 0;
        local_6c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = 0;
        local_7b0 = (_Base_ptr)local_7d0._24_8_;
        if (0 < (int)uVar33) {
          do {
            pmVar25 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)local_638,(key_type_conflict *)&local_6c0);
            iVar10 = *pmVar25;
            lVar38 = CONCAT44(local_730.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              (uint)local_730.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            ppvVar19 = std::
                       map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                       ::operator[]((map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                                     *)local_7d0,(key_type_conflict *)&local_6c0);
            *ppvVar19 = (mapped_type)(lVar38 + iVar10);
            local_6c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start._0_4_ =
                 (int)local_6c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + 1;
          } while ((int)local_6c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start < (int)uVar33);
        }
        ub::anon_unknown_12::copyUniformData
                  ((UniformLayout *)local_798,
                   (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                    *)local_7d0,&local_6f8,
                   (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                    *)local_420);
        dVar12 = ub::UniformBufferManager::allocBuffer((UniformBufferManager *)&local_760);
        (**(code **)(local_7e0 + 0x40))(0x8a11,dVar12);
        piVar5 = (pointer)CONCAT44(local_730.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,
                                   (uint)local_730.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start);
        if (piVar5 != local_730.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
          (**(code **)(local_7e0 + 0x150))
                    (0x8a11,(long)local_730.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (long)piVar5,piVar5,0x88e4);
        }
        dVar14 = (**(code **)(local_7e0 + 0x800))();
        glu::checkError(dVar14,"Failed to upload uniform buffer data",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
                        ,0x615);
        local_6c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = 0;
        if (0 < (int)uVar33) {
          do {
            iVar10 = (int)local_6c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
            pcVar3 = *(code **)(local_7e0 + 0x50);
            pmVar25 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)local_638,(key_type_conflict *)&local_6c0);
            (*pcVar3)(0x8a11,iVar10,dVar12,(long)*pmVar25,
                      (long)*(int *)(local_798._0_8_ +
                                    (long)(int)local_6c0.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start * 0x40 + 0x20));
            dVar14 = (**(code **)(local_7e0 + 0x800))();
            glu::checkError(dVar14,"glBindBufferRange(GL_UNIFORM_BUFFER) failed",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
                            ,0x61c);
            local_6c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start._0_4_ =
                 (int)local_6c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + 1;
          } while ((int)local_6c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start < (int)uVar33);
        }
        std::
        _Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
        ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                     *)local_7d0);
        pvVar4 = (void *)CONCAT44(local_730.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._4_4_,
                                  (uint)local_730.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
        if (pvVar4 != (void *)0x0) {
          operator_delete(pvVar4,(long)local_730.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)pvVar4);
        }
        std::
        _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
        ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     *)local_638);
      }
      bVar39 = render(local_7e8,local_3f0.m_program.m_program);
      if (!bVar39) {
        tcu::TestContext::setTestResult
                  ((local_7e8->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                   "Image compare failed");
      }
      ub::UniformBufferManager::~UniformBufferManager((UniformBufferManager *)&local_760);
    }
    else {
      tcu::TestContext::setTestResult
                ((local_7e8->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Invalid layout");
    }
    std::
    vector<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>::
    ~vector(&vStack_780);
    std::vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>::
    ~vector((vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
             *)local_798);
  }
  glu::ShaderProgram::~ShaderProgram(&local_3f0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base(local_2b0);
  std::
  _Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
               *)local_420);
  if (local_668.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_668.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_668.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_668.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
  ::~vector(&local_6f8.uniforms);
  std::vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>::
  ~vector(&local_6f8.blocks);
  return STOP;
}

Assistant:

UniformBlockCase::IterateResult UniformBlockCase::iterate (void)
{
	TestLog&				log				= m_testCtx.getLog();
	const glw::Functions&	gl				= m_renderCtx.getFunctions();
	UniformLayout			refLayout;		//!< std140 layout.
	vector<deUint8>			data;			//!< Data.
	map<int, void*>			blockPointers;	//!< Reference block pointers.

	// Initialize result to pass.
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	// Compute reference layout.
	computeStd140Layout(refLayout, m_interface);

	// Assign storage for reference values.
	{
		int totalSize = 0;
		for (vector<BlockLayoutEntry>::const_iterator blockIter = refLayout.blocks.begin(); blockIter != refLayout.blocks.end(); blockIter++)
			totalSize += blockIter->size;
		data.resize(totalSize);

		// Pointers for each block.
		int curOffset = 0;
		for (int blockNdx = 0; blockNdx < (int)refLayout.blocks.size(); blockNdx++)
		{
			blockPointers[blockNdx] = &data[0] + curOffset;
			curOffset += refLayout.blocks[blockNdx].size;
		}
	}

	// Generate values.
	generateValues(refLayout, blockPointers, 1 /* seed */);

	// Generate shaders and build program.
	std::ostringstream vtxSrc;
	std::ostringstream fragSrc;

	generateVertexShader(vtxSrc, m_glslVersion, m_interface, refLayout, blockPointers);
	generateFragmentShader(fragSrc, m_glslVersion, m_interface, refLayout, blockPointers);

	glu::ShaderProgram program(m_renderCtx, glu::makeVtxFragSources(vtxSrc.str(), fragSrc.str()));
	log << program;

	if (!program.isOk())
	{
		// Compile failed.
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compile failed");
		return STOP;
	}

	// Query layout from GL.
	UniformLayout glLayout;
	getGLUniformLayout(gl, glLayout, program.getProgram());

	// Print layout to log.
	log << TestLog::Section("ActiveUniformBlocks", "Active Uniform Blocks");
	for (int blockNdx = 0; blockNdx < (int)glLayout.blocks.size(); blockNdx++)
		log << TestLog::Message << blockNdx << ": " << glLayout.blocks[blockNdx] << TestLog::EndMessage;
	log << TestLog::EndSection;

	log << TestLog::Section("ActiveUniforms", "Active Uniforms");
	for (int uniformNdx = 0; uniformNdx < (int)glLayout.uniforms.size(); uniformNdx++)
		log << TestLog::Message << uniformNdx << ": " << glLayout.uniforms[uniformNdx] << TestLog::EndMessage;
	log << TestLog::EndSection;

	// Check that we can even try rendering with given layout.
	if (!checkLayoutIndices(glLayout) || !checkLayoutBounds(glLayout) || !compareTypes(refLayout, glLayout))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid layout");
		return STOP; // It is not safe to use the given layout.
	}

	// Verify all std140 blocks.
	if (!compareStd140Blocks(refLayout, glLayout))
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid std140 layout");

	// Verify all shared blocks - all uniforms should be active, and certain properties match.
	if (!compareSharedBlocks(refLayout, glLayout))
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid shared layout");

	// Check consistency with index queries
	if (!checkIndexQueries(program.getProgram(), glLayout))
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Inconsintent block index query results");

	// Use program.
	gl.useProgram(program.getProgram());

	// Assign binding points to all active uniform blocks.
	for (int blockNdx = 0; blockNdx < (int)glLayout.blocks.size(); blockNdx++)
	{
		deUint32 binding = (deUint32)blockNdx; // \todo [2012-01-25 pyry] Randomize order?
		gl.uniformBlockBinding(program.getProgram(), (deUint32)blockNdx, binding);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to set uniform block bindings");

	// Allocate buffers, write data and bind to targets.
	UniformBufferManager bufferManager(m_renderCtx);
	if (m_bufferMode == BUFFERMODE_PER_BLOCK)
	{
		int							numBlocks			= (int)glLayout.blocks.size();
		vector<vector<deUint8> >	glData				(numBlocks);
		map<int, void*>				glBlockPointers;

		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
		{
			glData[blockNdx].resize(glLayout.blocks[blockNdx].size);
			glBlockPointers[blockNdx] = &glData[blockNdx][0];
		}

		copyUniformData(glLayout, glBlockPointers, refLayout, blockPointers);

		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
		{
			deUint32	buffer	= bufferManager.allocBuffer();
			deUint32	binding	= (deUint32)blockNdx;

			gl.bindBuffer(GL_UNIFORM_BUFFER, buffer);
			gl.bufferData(GL_UNIFORM_BUFFER, (glw::GLsizeiptr)glData[blockNdx].size(), &glData[blockNdx][0], GL_STATIC_DRAW);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to upload uniform buffer data");

			gl.bindBufferBase(GL_UNIFORM_BUFFER, binding, buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase(GL_UNIFORM_BUFFER) failed");
		}
	}
	else
	{
		DE_ASSERT(m_bufferMode == BUFFERMODE_SINGLE);

		int				totalSize			= 0;
		int				curOffset			= 0;
		int				numBlocks			= (int)glLayout.blocks.size();
		int				bindingAlignment	= 0;
		map<int, int>	glBlockOffsets;

		gl.getIntegerv(GL_UNIFORM_BUFFER_OFFSET_ALIGNMENT, &bindingAlignment);

		// Compute total size and offsets.
		curOffset = 0;
		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
		{
			if (bindingAlignment > 0)
				curOffset = deRoundUp32(curOffset, bindingAlignment);
			glBlockOffsets[blockNdx] = curOffset;
			curOffset += glLayout.blocks[blockNdx].size;
		}
		totalSize = curOffset;

		// Assign block pointers.
		vector<deUint8>	glData(totalSize);
		map<int, void*>	glBlockPointers;

		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
			glBlockPointers[blockNdx] = &glData[glBlockOffsets[blockNdx]];

		// Copy to gl format.
		copyUniformData(glLayout, glBlockPointers, refLayout, blockPointers);

		// Allocate buffer and upload data.
		deUint32 buffer = bufferManager.allocBuffer();
		gl.bindBuffer(GL_UNIFORM_BUFFER, buffer);
		if (!glData.empty())
			gl.bufferData(GL_UNIFORM_BUFFER, (glw::GLsizeiptr)glData.size(), &glData[0], GL_STATIC_DRAW);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to upload uniform buffer data");

		// Bind ranges to binding points.
		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
		{
			deUint32 binding = (deUint32)blockNdx;
			gl.bindBufferRange(GL_UNIFORM_BUFFER, binding, buffer, (glw::GLintptr)glBlockOffsets[blockNdx], (glw::GLsizeiptr)glLayout.blocks[blockNdx].size);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferRange(GL_UNIFORM_BUFFER) failed");
		}
	}

	bool renderOk = render(program.getProgram());
	if (!renderOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image compare failed");

	return STOP;
}